

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cflags.h
# Opt level: O0

cflags_flag_t *
cflags_add_string(cflags_t *flags,char short_name,char *long_name,char **value,char *description)

{
  anon_union_8_8_ee387bc5_for_cflags_flag_6 in_RCX;
  char *in_RDX;
  char in_SIL;
  char *in_R8;
  cflags_flag_t *flag;
  cflags_t *in_stack_ffffffffffffffc8;
  cflags_flag_t *local_8;
  
  local_8 = _cflags_add_flag(in_stack_ffffffffffffffc8);
  if (local_8 == (cflags_flag_t *)0x0) {
    local_8 = (cflags_flag_t *)0x0;
  }
  else {
    local_8->short_name = in_SIL;
    local_8->long_name = in_RDX;
    local_8->type = CFLAGS_TYPE_STRING;
    local_8->field_6 = in_RCX;
    local_8->description = in_R8;
  }
  return local_8;
}

Assistant:

static cflags_flag_t * cflags_add_string(cflags_t * flags, char short_name, const char * long_name, const char ** value, const char * description)
{
    cflags_flag_t * flag = _cflags_add_flag(flags);
    if (!flag) {
        return NULL;
    }

    flag->short_name = short_name;
    flag->long_name = long_name;
    flag->type = CFLAGS_TYPE_STRING;
    flag->string_value = value;
    flag->description = description;
    return flag;
}